

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

int vkt::pipeline::anon_unknown_0::SamplerTest::getArraySize(VkImageViewType viewType)

{
  if (viewType - VK_IMAGE_VIEW_TYPE_CUBE < 4) {
    return *(int *)(&DAT_0095e170 + (ulong)(viewType - VK_IMAGE_VIEW_TYPE_CUBE) * 4);
  }
  return 1;
}

Assistant:

int SamplerTest::getArraySize (VkImageViewType viewType)
{
	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			return 6;

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			return 36;

		default:
			break;
	}

	return 1;
}